

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O2

Am_Priority_List_Item * __thiscall
Am_Priority_List::take_out_obj(Am_Priority_List *this,Am_Object *obj)

{
  Am_Priority_List_Item *item;
  bool bVar1;
  Am_Priority_List_Item **ppAVar2;
  
  ppAVar2 = &this->head;
  while( true ) {
    item = *ppAVar2;
    if (item == (Am_Priority_List_Item *)0x0) {
      return (Am_Priority_List_Item *)0x0;
    }
    bVar1 = Am_Object::operator==(&item->obj,obj);
    if (bVar1) break;
    ppAVar2 = &item->next;
  }
  take_out_item(this,item);
  return item;
}

Assistant:

Am_Priority_List_Item *
Am_Priority_List::take_out_obj(Am_Object obj)
{
  Am_Priority_List_Item *p = head;
  for (; p != nullptr; p = p->next) {
    if (p->obj == obj)
      return this->take_out_item(p);
  }
  return nullptr;
}